

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall despot::BaseTag::Init(BaseTag *this,istream *is)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  pointer pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TagState *this_02;
  _Rb_tree_node_base *p_Var5;
  _Self __tmp;
  long lVar6;
  long lVar7;
  State next;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_60;
  
  ReadConfig(this,is);
  iVar2 = (**(code **)(*(long *)this + 0x10))(this);
  std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::resize
            (&this->states_,(long)iVar2);
  this_00 = &this->rob_;
  iVar2 = (**(code **)(*(long *)this + 0x10))(this);
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)iVar2);
  this_01 = &this->opp_;
  iVar2 = (**(code **)(*(long *)this + 0x10))(this);
  std::vector<int,_std::allocator<int>_>::resize(this_01,(long)iVar2);
  for (iVar2 = 0; iVar3 = despot::Floor::NumCells(), iVar2 < iVar3; iVar2 = iVar2 + 1) {
    for (iVar3 = 0; iVar4 = despot::Floor::NumCells(), iVar3 < iVar4; iVar3 = iVar3 + 1) {
      iVar4 = despot::Floor::NumCells();
      iVar4 = iVar4 * iVar2 + iVar3;
      this_02 = (TagState *)operator_new(0x20);
      TagState::TagState(this_02,iVar4);
      (this->states_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar4] = this_02;
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[iVar4] = iVar2;
      (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[iVar4] = iVar3;
    }
  }
  iVar2 = (**(code **)(*(long *)this + 0x10))(this);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::resize(&this->transition_probabilities_,(long)iVar2);
  for (lVar7 = 0; iVar2 = (**(code **)(*(long *)this + 0x10))(this), lVar7 < iVar2;
      lVar7 = lVar7 + 1) {
    pvVar1 = (this->transition_probabilities_).
             super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar2 = (**(code **)(*(long *)this + 0x18))(this);
    std::
    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
    ::resize(pvVar1 + lVar7,(long)iVar2);
    OppTransitionDistribution
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               &local_60,this,(int)lVar7);
    for (lVar6 = 0; iVar2 = (**(code **)(*(long *)this + 0x18))(), lVar6 < iVar2; lVar6 = lVar6 + 1)
    {
      std::vector<despot::State,_std::allocator<despot::State>_>::clear
                ((vector<despot::State,_std::allocator<despot::State>_> *)
                 (*(long *)&(this->transition_probabilities_).
                            super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar7].
                            super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                            ._M_impl.super__Vector_impl_data + lVar6 * 0x18));
      NextRobPosition(this,(this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar7],(ACT_TYPE)lVar6);
      p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((lVar6 != 4) ||
         ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[lVar7] !=
          (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[lVar7])) {
        for (; (_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          despot::State::State(&next);
          despot::Floor::NumCells();
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back
                    ((vector<despot::State,_std::allocator<despot::State>_> *)
                     (*(long *)&(this->transition_probabilities_).
                                super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar7].
                                super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                ._M_impl.super__Vector_impl_data + lVar6 * 0x18),&next);
          despot::State::~State(&next);
        }
      }
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void BaseTag::Init(istream& is) {
	ReadConfig(is);

	TagState* state;
	states_.resize(NumStates());
	rob_.resize(NumStates());
	opp_.resize(NumStates());
	for (int rob = 0; rob < floor_.NumCells(); rob++) {
		for (int opp = 0; opp < floor_.NumCells(); opp++) {
			int s = RobOppIndicesToStateIndex(rob, opp);
			state = new TagState(s);
			states_[s] = state;
			rob_[s] = rob;
			opp_[s] = opp;
		}
	}

	// Build transition matrix
	transition_probabilities_.resize(NumStates());
	for (int s = 0; s < NumStates(); s++) {
		transition_probabilities_[s].resize(NumActions());

		const map<int, double>& opp_distribution = OppTransitionDistribution(s);
		for (int a = 0; a < NumActions(); a++) {
			transition_probabilities_[s][a].clear();

			int next_rob = NextRobPosition(rob_[s], a);

			if (!(a == TagAction() && rob_[s] == opp_[s])) { // No transition upon termination
				for (map<int, double>::const_iterator it = opp_distribution.begin();
					it != opp_distribution.end(); it++) {
					State next;
					next.state_id = RobOppIndicesToStateIndex(next_rob,
						it->first);
					next.weight = it->second;

					transition_probabilities_[s][a].push_back(next);
				}
			}
		}
	}
}